

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvacounter.c
# Opt level: O2

void print_difference(signal_difference diff)

{
  uint uVar1;
  undefined *puVar2;
  
  uVar1 = diff.change + ZERO_TO_ONE;
  if (uVar1 < 7) {
    puVar2 = &DAT_00104480 + *(int *)(&DAT_00104480 + (ulong)uVar1 * 4);
  }
  else {
    puVar2 = (undefined *)0x0;
  }
  printf("Diff at set %i, signal 0x%.2x): %i->%i/100 (%s?)\n",(ulong)(diff._0_4_ & 0xff),
         (ulong)(diff._1_4_ & 0xff),(ulong)(diff._8_4_ & 0xff),(ulong)(diff._8_4_ >> 8 & 0xff),
         puVar2);
  return;
}

Assistant:

void print_difference(struct signal_difference diff)
{
	const char *difference_s = NULL;

	switch(diff.change)
	{
	case NO_CHANGE:
		difference_s = "NO CHANGE";
		break;
	case ONE_TO_ZERO:
		difference_s = "ONE TO ZERO";
		break;
	case ZERO_TO_ONE:
		difference_s = "ZERO TO ONE";
		break;
	case OTHER_TO_ZERO:
		difference_s = "OTHER TO ZERO";
		break;
	case OTHER_TO_ONE:
		difference_s = "OTHER TO ONE";
		break;
	case ONE_TO_OTHER:
		difference_s = "ONE TO OTHER";
		break;
	case ZERO_TO_OTHER:
		difference_s = "ZERO TO OTHER";
		break;
	}
	printf("Diff at set %i, signal 0x%.2x): %i->%i/100 (%s?)\n",
			      diff.set, diff.signal, diff.count_before, diff.count_after, difference_s);
}